

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::GetNodeWithValidCharacterSet
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,EncodedChar cc)

{
  code *pcVar1;
  bool bVar2;
  MatchSetNode *pMVar3;
  MatchSetNode *pMVar4;
  ConcatNode *this_00;
  ConcatNode *this_01;
  undefined4 *puVar5;
  MatchSetNode *this_02;
  AltNode *this_03;
  AltNode *this_04;
  
  if ((((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) &&
     (this->unicodeFlagPresent == true)) {
    pMVar3 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
    MatchSetNode::MatchSetNode(pMVar3,false,false);
    CharSet<char16_t>::SetRange(&pMVar3->set,this->ctAllocator,L'\xd800',L'\xdbff');
    pMVar4 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
    MatchSetNode::MatchSetNode(pMVar4,false,false);
    CharSet<char16_t>::SetRange(&pMVar4->set,this->ctAllocator,L'\xdc00',L'\xdfff');
    this_00 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
    this_01 = (ConcatNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
    ConcatNode::ConcatNode(this_01,(Node *)pMVar4,(ConcatNode *)0x0);
    ConcatNode::ConcatNode(this_00,(Node *)pMVar3,this_01);
    pMVar4 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
    MatchSetNode::MatchSetNode(pMVar4,false,false);
    if (cc == L'W') {
      if (this->caseInsensitiveFlagPresent == true) {
        StandardChars<char16_t>::SetNonWordIUChars
                  (this->standardChars,this->ctAllocator,&pMVar4->set);
      }
      else {
        StandardChars<char16_t>::SetNonWordChars(this->standardChars,this->ctAllocator,&pMVar4->set)
        ;
      }
    }
    else if (cc == L'D') {
      StandardChars<char16_t>::SetNonDigits(this->standardChars,this->ctAllocator,&pMVar4->set);
    }
    else if (cc == L'S') {
      StandardChars<char16_t>::SetNonWhitespace(this->standardChars,this->ctAllocator,&pMVar4->set);
    }
    else if (cc == L'.') {
      if (this->dotAllFlagPresent == true) {
        StandardChars<char16_t>::SetFullSet(this->standardChars,this->ctAllocator,&pMVar4->set);
      }
      else {
        StandardChars<char16_t>::SetNonNewline(this->standardChars,this->ctAllocator,&pMVar4->set);
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc41,"(false)","");
      if (!bVar2) {
LAB_00d1f18c:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    CharSet<char16_t>::SubtractRange(&pMVar4->set,this->ctAllocator,L'\xd800',L'\xdbff');
    this_02 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
    MatchSetNode::MatchSetNode(this_02,false,false);
    CharSet<char16_t>::SetRange(&this_02->set,this->ctAllocator,L'\xd800',L'\xdbff');
    pMVar3 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
    this_03 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
    this_04 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
    AltNode::AltNode(this_04,(Node *)this_02,(AltNode *)0x0);
    AltNode::AltNode(this_03,(Node *)this_00,this_04);
    AltNode::AltNode((AltNode *)pMVar3,(Node *)pMVar4,this_03);
  }
  else {
    pMVar3 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
    MatchSetNode::MatchSetNode(pMVar3,false,false);
    if (cc == L'W') {
      StandardChars<char16_t>::SetNonWordChars(this->standardChars,this->ctAllocator,&pMVar3->set);
    }
    else if (cc == L'D') {
      StandardChars<char16_t>::SetNonDigits(this->standardChars,this->ctAllocator,&pMVar3->set);
    }
    else if (cc == L'S') {
      StandardChars<char16_t>::SetNonWhitespace(this->standardChars,this->ctAllocator,&pMVar3->set);
    }
    else if (cc == L'.') {
      if (this->dotAllFlagPresent == true) {
        StandardChars<char16_t>::SetFullSet(this->standardChars,this->ctAllocator,&pMVar3->set);
      }
      else {
        StandardChars<char16_t>::SetNonNewline(this->standardChars,this->ctAllocator,&pMVar3->set);
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc65,"(false)","");
      if (!bVar2) goto LAB_00d1f18c;
      *puVar5 = 0;
    }
  }
  return &pMVar3->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::GetNodeWithValidCharacterSet(EncodedChar cc)
    {
        Node* nodeToReturn = nullptr;
        if (this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && this->unicodeFlagPresent)
        {
            MatchSetNode *lowerRangeNode = Anew(ctAllocator, MatchSetNode, false, false);
            lowerRangeNode->set.SetRange(ctAllocator, (Char)0xD800, (Char)0xDBFF);
            MatchSetNode *upperRangeNode = Anew(ctAllocator, MatchSetNode, false, false);
            upperRangeNode->set.SetRange(ctAllocator, (Char)0xDC00, (Char)0xDFFF);

            ConcatNode* surrogateRangePairNode = Anew(ctAllocator, ConcatNode, lowerRangeNode, Anew(ctAllocator, ConcatNode, upperRangeNode, nullptr));

            // The MatchSet node will be split into [0-D7FFDC00-FFFF] (minus special characters like newline, whitespace, etc.) as a prefix, and a suffix of [D800-DBFF]
            // i.e. The MatchSet node can be with [0-D7FFDC00-FFFF] (minus special characters like newline, whitespace, etc.) OR [D800-DBFF]
            MatchSetNode* partialPrefixSetNode = Anew(ctAllocator, MatchSetNode, false, false);
            switch (cc)
            {
            case '.':
                if (this->dotAllFlagPresent)
                {
                    standardChars->SetFullSet(ctAllocator, partialPrefixSetNode->set);
                }
                else
                {
                    standardChars->SetNonNewline(ctAllocator, partialPrefixSetNode->set);
                }
                break;
            case 'S':
                standardChars->SetNonWhitespace(ctAllocator, partialPrefixSetNode->set);
                break;
            case 'D':
                standardChars->SetNonDigits(ctAllocator, partialPrefixSetNode->set);
                break;
            case 'W':
                if (this->caseInsensitiveFlagPresent)
                {
                    standardChars->SetNonWordIUChars(ctAllocator, partialPrefixSetNode->set);
                }
                else
                {
                    standardChars->SetNonWordChars(ctAllocator, partialPrefixSetNode->set);
                }
                break;
            default:
                AssertMsg(false, "");
            }

            partialPrefixSetNode->set.SubtractRange(ctAllocator, (Char)0xD800u, (Char)0xDBFFu);

            MatchSetNode* partialSuffixSetNode = Anew(ctAllocator, MatchSetNode, false, false);
            partialSuffixSetNode->set.SetRange(ctAllocator, (Char)0xD800u, (Char)0xDBFFu);

            AltNode* altNode = Anew(ctAllocator, AltNode, partialPrefixSetNode, Anew(ctAllocator, AltNode, surrogateRangePairNode, Anew(ctAllocator, AltNode, partialSuffixSetNode, nullptr)));
            nodeToReturn = altNode;
        }
        else
        {
            MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false, false);
            switch (cc)
            {
            case '.':
                if (this->dotAllFlagPresent)
                {
                    standardChars->SetFullSet(ctAllocator, setNode->set);
                }
                else
                {
                    standardChars->SetNonNewline(ctAllocator, setNode->set);
                }
                break;
            case 'S':
                standardChars->SetNonWhitespace(ctAllocator, setNode->set);
                break;
            case 'D':
                standardChars->SetNonDigits(ctAllocator, setNode->set);
                break;
            case 'W':
                standardChars->SetNonWordChars(ctAllocator, setNode->set);
                break;
            default:
                AssertMsg(false, "");
            }
            nodeToReturn = setNode;
        }

        return nodeToReturn;
    }